

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles3::Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int numBytes)

{
  ostream *poVar1;
  int precision;
  int iVar2;
  string local_1e0;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream buf;
  int numBytes_local;
  
  iVar2 = (int)this;
  std::__cxx11::ostringstream::ostringstream(local_190);
  if (iVar2 < 0x400) {
    poVar1 = (ostream *)std::ostream::operator<<(local_190,iVar2);
    std::operator<<(poVar1," byte(s)");
  }
  else if (iVar2 < 0x100000) {
    de::floatToString_abi_cxx11_
              (&local_1c0,(de *)&DAT_00000001,(float)iVar2 * 0.0009765625,precision);
    poVar1 = std::operator<<((ostream *)local_190,(string *)&local_1c0);
    std::operator<<(poVar1," KiB");
    std::__cxx11::string::~string((string *)&local_1c0);
  }
  else {
    de::floatToString_abi_cxx11_
              (&local_1e0,(de *)&DAT_00000001,(float)iVar2 * 0.0009765625 * 0.0009765625,precision);
    poVar1 = std::operator<<((ostream *)local_190,(string *)&local_1e0);
    std::operator<<(poVar1," MiB");
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static std::string getHumanReadableByteSize (int numBytes)
{
	std::ostringstream buf;

	if (numBytes < 1024)
		buf << numBytes << " byte(s)";
	else if (numBytes < 1024 * 1024)
		buf << de::floatToString((float)numBytes/1024.0f, 1) << " KiB";
	else
		buf << de::floatToString((float)numBytes/1024.0f/1024.0f, 1) << " MiB";

	return buf.str();
}